

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

void Omega_h::map_into_range<long>
               (Read<signed_char> *a_data,LO begin,LO end,Write<signed_char> *b_data,Int width)

{
  undefined1 local_70 [8];
  type f;
  LO na;
  Int width_local;
  Write<signed_char> *b_data_local;
  LO end_local;
  LO begin_local;
  Read<signed_char> *a_data_local;
  ulong local_10;
  
  f.a_data.write_.shared_alloc_.direct_ptr._0_4_ = end - begin;
  if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a_data->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a_data->write_).shared_alloc_.alloc >> 3;
  }
  f.a_data.write_.shared_alloc_.direct_ptr._4_4_ = width;
  if ((int)(local_10 >> 3) == (int)f.a_data.write_.shared_alloc_.direct_ptr * width) {
    local_70._0_4_ = begin;
    local_70._4_4_ = width;
    Write<long>::Write((Write<long> *)&f,(Write<int> *)b_data);
    Read<long>::Read((Read<long> *)&f.b_data.shared_alloc_.direct_ptr,(Read<int> *)a_data);
    parallel_for<Omega_h::map_into_range<long>(Omega_h::Read<long>,int,int,Omega_h::Write<long>,int)::_lambda(int)_1_>
              ((int)f.a_data.write_.shared_alloc_.direct_ptr,(type *)local_70,"map_into_range");
    map_into_range<long>(Omega_h::Read<long>,int,int,Omega_h::Write<long>,int)::{lambda(int)#1}::
    ~Write((_lambda_int__1_ *)local_70);
    return;
  }
  fail("assertion %s failed at %s +%d\n","a_data.size() == na * width",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x32);
}

Assistant:

void map_into_range(
    Read<T> a_data, LO begin, LO end, Write<T> b_data, Int width) {
  auto na = end - begin;
  OMEGA_H_CHECK(a_data.size() == na * width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = begin + a;
    for (Int j = 0; j < width; ++j) {
      b_data[b * width + j] = a_data[a * width + j];
    }
  };
  parallel_for(na, f, "map_into_range");
}